

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

void __thiscall Fad<long_double>::Fad(Fad<long_double> *this,int sz,longdouble *x)

{
  unkbyte10 *in_RDX;
  FadSuper *in_RDI;
  longdouble *unaff_retaddr;
  int in_stack_0000000c;
  Vector<long_double> *in_stack_00000010;
  
  FadSuper::FadSuper(in_RDI);
  *(unkbyte10 *)in_RDI = *in_RDX;
  Vector<long_double>::Vector(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
  *(longdouble *)(in_RDI + 0x20) = (longdouble)0;
  return;
}

Assistant:

Fad(const int sz, const T & x) : val_(x), dx_(sz,T(0)), defaultVal(T(0)) {;}